

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FractionalSpacingModeCase::iterate
          (FractionalSpacingModeCase *this)

{
  ostringstream *poVar1;
  SpacingMode SVar2;
  TestLog *pTVar3;
  RenderContext *pRVar4;
  _Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,_deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_float>_>
  __comp;
  _Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,_deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_float>_>
  __comp_00;
  _Val_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,_deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_float>_>
  __comp_01;
  _Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,_deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_float>_>
  __comp_02;
  bool bVar5;
  pointer pfVar6;
  size_type sVar7;
  pointer pSVar8;
  pointer pSVar9;
  int iVar10;
  deUint32 dVar11;
  undefined4 uVar12;
  int iVar13;
  deUint32 dVar14;
  GLenum GVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> _Var16;
  undefined4 extraout_var_01;
  Functions *gl;
  void *pvVar17;
  char *pcVar18;
  pointer pLVar19;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
  *p_Var20;
  MessageBuilder *pMVar21;
  pointer __p;
  pointer pLVar22;
  pointer pLVar23;
  pointer pfVar24;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>_>
  __first;
  TestError *this_00;
  ulong uVar25;
  ulong uVar26;
  pointer pfVar27;
  long lVar28;
  Segment extraout_RDX;
  Segment __n;
  byte bVar29;
  float *value;
  int i;
  pointer pLVar30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__n_00;
  long lVar31;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
  *this_01;
  ostringstream *this_02;
  PrimitiveList *primitives;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>_>
  __i;
  pointer pLVar32;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>_>
  _Var33;
  int iVar34;
  long lVar35;
  pointer pLVar36;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
  *this_03;
  int rangeNdx;
  long lVar37;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
  *this_04;
  LineData *value_00;
  float fVar38;
  float clampedTessLevel;
  float fVar39;
  float in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  float in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff984;
  float additionalSegmentLength;
  vector<float,_std::allocator<float>_> result_2;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
  segmentsB;
  qpTestResult local_600;
  int additionalSegmentLocation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  long local_5d8;
  vector<float,_std::allocator<float>_> sortedCoords;
  vector<float,_std::allocator<float>_> tessLevelCases;
  RandomViewport viewport;
  float local_570;
  undefined4 uStack_56c;
  Result tfResult;
  vector<int,_std::allocator<int>_> additionalSegmentLocations;
  vector<float,_std::allocator<float>_> additionalSegmentLengths;
  TFHandler tfHandler;
  undefined1 local_4b0 [8];
  undefined1 local_4a8 [376];
  undefined1 local_330 [8];
  ostream local_328;
  string failNote;
  undefined4 extraout_var_02;
  
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar10 = (*pRVar4->_vptr_RenderContext[4])(pRVar4);
  dVar11 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var,iVar10),0x10,0x10,dVar11);
  dVar11 = (((this->m_program).m_ptr)->m_program).m_program;
  iVar10 = (*pRVar4->_vptr_RenderContext[3])(pRVar4);
  local_5d8 = CONCAT44(extraout_var_00,iVar10);
  uVar12 = (**(code **)(local_5d8 + 0xb48))(dVar11,"u_tessLevelOuter1");
  tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (lVar37 = 0; lVar37 != 3; lVar37 = lVar37 + 1) {
    in_stack_fffffffffffff978 =
         (float)(&Functional::(anonymous_namespace)::FractionalSpacingModeCase::genTessLevelCases()
                  ::rangeStarts)[lVar37];
    for (iVar10 = 0; iVar10 != 10; iVar10 = iVar10 + 1) {
      local_4b0._0_4_ = (float)iVar10 / 10.0 + in_stack_fffffffffffff978;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                (&tessLevelCases,(float *)local_4b0);
    }
  }
  for (iVar10 = 0; iVar10 != 0x3f; iVar10 = iVar10 + 1) {
    local_4b0._0_4_ = (float)iVar10 + 0.3;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (&tessLevelCases,(float *)local_4b0);
  }
  SVar2 = this->m_spacing;
  _Var16 = std::
           __max_element<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                     (tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  iVar10 = getClampedRoundedTessLevel(SVar2,*_Var16._M_current);
  additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
  tfHandler.m_renderCtx = pRVar4;
  glu::TypedObjectWrapper<(glu::ObjectType)4>::TypedObjectWrapper(&tfHandler.m_tf,pRVar4);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper(&tfHandler.m_tfBuffer,pRVar4);
  glu::TypedObjectWrapper<(glu::ObjectType)6>::TypedObjectWrapper(&tfHandler.m_tfPrimQuery,pRVar4);
  iVar13 = (*(tfHandler.m_renderCtx)->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar13) + 0x40))
            (0x8c8e,tfHandler.m_tfBuffer.super_ObjectWrapper.m_object);
  (**(code **)(CONCAT44(extraout_var_01,iVar13) + 0x150))(0x8c8e,(long)(iVar10 * 4 + 0x10),0,0x88e9)
  ;
  lVar37 = local_5d8;
  (**(code **)(local_5d8 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  (**(code **)(lVar37 + 0x1680))(dVar11);
  (**(code **)(lVar37 + 0xfd8))(0x8e72);
  local_600 = QP_TEST_RESULT_FAIL;
  for (pLVar30 = (pointer)0x0;
      (long)pLVar30 <
      (long)(int)((ulong)((long)tessLevelCases.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)tessLevelCases.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
      pLVar30 = (pointer)((long)&pLVar30->tessLevel + 1)) {
    fVar38 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[(long)pLVar30];
    (**(code **)(lVar37 + 0x14e0))(uVar12);
    dVar14 = (**(code **)(lVar37 + 0x800))();
    glu::checkError(dVar14,"Setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                    ,0x8cd);
    iVar10 = (*(tfHandler.m_renderCtx)->_vptr_RenderContext[3])();
    gl = (Functions *)CONCAT44(extraout_var_02,iVar10);
    (*gl->bindTransformFeedback)(0x8e22,tfHandler.m_tf.super_ObjectWrapper.m_object);
    (*gl->bindBuffer)(0x8c8e,tfHandler.m_tfBuffer.super_ObjectWrapper.m_object);
    (*gl->bindBufferBase)(0x8c8e,0,tfHandler.m_tfBuffer.super_ObjectWrapper.m_object);
    (*gl->beginQuery)(0x8c88,tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object);
    (*gl->beginTransformFeedback)(0);
    local_4b0 = (undefined1  [8])0x100000007;
    local_4a8._0_4_ = INDEXTYPE_LAST;
    local_4a8._8_8_ = (void *)0x0;
    primitives = (PrimitiveList *)local_4b0;
    glu::draw(tfHandler.m_renderCtx,dVar11,0,(VertexArrayBinding *)0x0,primitives,
              (DrawUtilCallback *)0x0);
    iVar10 = (int)primitives;
    GVar15 = (*gl->getError)();
    glu::checkError(GVar15,"Draw failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                    ,0x15e);
    (*gl->endTransformFeedback)();
    (*gl->endQuery)(0x8c88);
    dVar14 = getQueryResult(gl,tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_570,(long)(int)dVar14,
               (allocator_type *)local_4b0);
    lVar37 = CONCAT44(uStack_56c,local_570);
    in_stack_fffffffffffff97c = 0;
    additionalSegmentLength = (float)(dVar14 * 4);
    pvVar17 = (*gl->mapBufferRange)(0x8c8e,0,(long)(int)additionalSegmentLength,1);
    GVar15 = (*gl->getError)();
    sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
    sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_1_ = 0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result_2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &sortedCoords,"glMapBufferRange(");
    pcVar18 = glu::getBufferTargetName(0x8c8e);
    std::operator+(&local_5f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result_2,
                   pcVar18);
    std::operator+(&failNote,&local_5f8,", 0, ");
    de::toString<int>((string *)&segmentsB,(int *)&additionalSegmentLength);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                   &failNote,(string *)&segmentsB);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                   ", GL_MAP_READ_BIT)");
    glu::checkError(GVar15,(char *)local_4b0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                    ,0x10d);
    std::__cxx11::string::~string((string *)local_4b0);
    std::__cxx11::string::~string((string *)local_330);
    std::__cxx11::string::~string((string *)&segmentsB);
    std::__cxx11::string::~string((string *)&failNote);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::__cxx11::string::~string((string *)&result_2);
    std::__cxx11::string::~string((string *)&sortedCoords);
    if (pvVar17 == (void *)0x0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"mappedData != DE_NULL",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                 ,0x10e);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    uVar26 = (ulong)dVar14;
    if ((int)dVar14 < 1) {
      uVar26 = 0;
    }
    for (uVar25 = 0; uVar26 != uVar25; uVar25 = uVar25 + 1) {
      *(undefined4 *)(lVar37 + uVar25 * 4) = *(undefined4 *)((long)pvVar17 + uVar25 * 4);
    }
    (*gl->unmapBuffer)(0x8c8e);
    iVar13 = (int)uVar25;
    tfResult.numPrimitives = dVar14;
    std::vector<float,_std::allocator<float>_>::vector
              (&tfResult.varying,(vector<float,_std::allocator<float>_> *)&local_570);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&local_570);
    SVar2 = this->m_spacing;
    local_570 = fVar38;
    in_stack_fffffffffffff978 = getClampedTessLevel(SVar2,fVar38);
    in_stack_fffffffffffff980 = (float)getRoundedTessLevel(SVar2,in_stack_fffffffffffff978);
    std::vector<float,_std::allocator<float>_>::vector(&sortedCoords,&tfResult.varying);
    std::
    __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish);
    de::toString<float>(&local_5f8,&local_570);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                   "Note: tessellation level is ",&local_5f8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                   "\nNote: sorted coordinates are:\n    ");
    containerStr<std::vector<float,std::allocator<float>>>
              ((string *)&result_2,(Functional *)&sortedCoords,
               (vector<float,_std::allocator<float>_> *)0x0,iVar13,iVar10);
    __n_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0;
    std::operator+(&failNote,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0,
                   (string *)&result_2);
    std::__cxx11::string::~string((string *)&result_2);
    std::__cxx11::string::~string((string *)local_4b0);
    std::__cxx11::string::~string((string *)local_330);
    std::__cxx11::string::~string((string *)&local_5f8);
    if ((int)in_stack_fffffffffffff980 + 1U !=
        (int)((ulong)((long)tfResult.varying.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)tfResult.varying.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 2)) {
      local_330 = (undefined1  [8])pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
      std::operator<<(&local_328,"Failure: number of vertices is ");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_328);
      std::operator<<(&local_328,"; expected ");
      std::ostream::operator<<((ostringstream *)&local_328,(int)in_stack_fffffffffffff980 + 1U);
      std::operator<<(&local_328," (clamped tessellation level is ");
      std::ostream::operator<<((ostringstream *)&local_328,in_stack_fffffffffffff978);
      std::operator<<(&local_328,")");
      std::operator<<(&local_328,"; final level (clamped level rounded up to ");
      pcVar18 = "odd";
      if (SVar2 == SPACINGMODE_FRACTIONAL_EVEN) {
        pcVar18 = "even";
      }
      std::operator<<(&local_328,pcVar18);
      std::operator<<(&local_328,") is ");
      std::ostream::operator<<((ostringstream *)&local_328,(int)in_stack_fffffffffffff980);
      std::operator<<(&local_328,
                      " and should equal the number of segments, i.e. number of vertices minus 1");
      local_4b0 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_330,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
      std::operator<<((ostream *)local_4a8,(string *)&failNote);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_01212108:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
      std::__cxx11::string::~string((string *)&failNote);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&sortedCoords.super__Vector_base<float,_std::allocator<float>_>);
LAB_01212132:
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&tfResult.varying.super__Vector_base<float,_std::allocator<float>_>);
      pcVar18 = "Invalid tessellation coordinates";
      goto LAB_0121260b;
    }
    if ((((*sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != 0.0) ||
         (NAN(*sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start))) ||
        (sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish[-1] != 1.0)) ||
       (NAN(sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]))) {
      local_330 = (undefined1  [8])pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
      std::operator<<(&local_328,
                      "Failure: smallest coordinate should be 0.0 and biggest should be 1.0");
      local_4b0 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_330,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
      std::operator<<((ostream *)local_4a8,(string *)&failNote);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_01212108;
    }
    if ((int)in_stack_fffffffffffff980 < 0) {
      std::__throw_length_error("cannot create std::vector larger than max_size()");
    }
    this_03 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
               *)(long)(int)in_stack_fffffffffffff980;
    pLVar19 = (pointer)std::
                       _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                       ::_M_allocate(this_03,(size_t)__n_00);
    local_5f8.field_2._M_allocated_capacity = (size_type)(&pLVar19->tessLevel + (long)this_03 * 2);
    lVar37 = 0;
    lVar31 = 0;
    for (p_Var20 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    *)0x0; this_03 != p_Var20;
        p_Var20 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                   *)((long)&(p_Var20->_M_impl).super__Vector_impl_data._M_start + 1)) {
      *(undefined8 *)(&pLVar19->tessLevel + (long)p_Var20 * 2) = 0xbf800000ffffffff;
      lVar31 = lVar31 + -8;
      lVar37 = lVar37 + 0x100000000;
    }
    local_5f8._M_string_length = (long)pLVar19 - lVar31;
    for (uVar26 = 0; (uint)in_stack_fffffffffffff980 != uVar26; uVar26 = uVar26 + 1) {
      fVar38 = sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[uVar26 + 1];
      fVar39 = sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[uVar26];
      (&pLVar19->tessLevel)[uVar26 * 2] = (float)uVar26;
      (&pLVar19->additionalSegmentLength)[uVar26 * 2] = fVar38 - fVar39;
    }
    local_5f8._M_dataplus._M_p = (pointer)pLVar19;
    std::vector<float,_std::allocator<float>_>::vector
              (&result_2,-lVar31 >> 3,(allocator_type *)&segmentsB);
    lVar37 = lVar37 >> 0x20;
    lVar35 = 0;
    if (0 < lVar37) {
      lVar35 = lVar37;
    }
    for (lVar28 = 0; lVar35 != lVar28; lVar28 = lVar28 + 1) {
      result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar28] = (&pLVar19->additionalSegmentLength)[lVar28 * 2];
    }
    containerStr<std::vector<float,std::allocator<float>>>
              ((string *)local_330,(Functional *)&result_2,
               (vector<float,_std::allocator<float>_> *)0x0,(int)lVar35,iVar10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0,
                   "\nNote: segment lengths are, from left to right:\n    ",(string *)local_330);
    std::__cxx11::string::append((string *)&failNote);
    in_stack_fffffffffffff984 = 0;
    std::__cxx11::string::~string((string *)local_4b0);
    std::__cxx11::string::~string((string *)local_330);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&result_2.super__Vector_base<float,_std::allocator<float>_>);
    result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    segmentsB.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    segmentsB.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    segmentsB.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                 *)&result_2.super__Vector_base<float,_std::allocator<float>_>,(value_type *)pLVar19
               );
    pLVar32 = pLVar19 + 1;
    for (lVar35 = 1;
        pSVar8 = segmentsB.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        pfVar6 = result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
        pfVar27 = result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish,
        pfVar24 = result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start, lVar35 < lVar37; lVar35 = lVar35 + 1) {
      fVar39 = pLVar32->tessLevel -
               result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[1];
      fVar38 = -fVar39;
      if (-fVar39 <= fVar39) {
        fVar38 = fVar39;
      }
      this_01 = (vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                 *)&result_2;
      if ((0.001 <= fVar38) &&
         (this_01 = &segmentsB,
         segmentsB.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         segmentsB.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
         ._M_impl.super__Vector_impl_data._M_finish)) {
        fVar39 = pLVar32->tessLevel -
                 (segmentsB.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_start)->length;
        fVar38 = -fVar39;
        if (-fVar39 <= fVar39) {
          fVar38 = fVar39;
        }
        if (0.001 <= fVar38) {
          local_330 = (undefined1  [8])pTVar3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
          std::operator<<(&local_328,"Failure: couldn\'t divide segments to 2 groups by length; ");
          std::operator<<(&local_328,"e.g. segment of length ");
          pMVar21 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_330,&pLVar32->tessLevel)
          ;
          std::operator<<(&(pMVar21->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          " isn\'t approximately equal to either ");
          pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,pfVar24 + 1);
          std::operator<<(&(pMVar21->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          " or ");
          pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,&pSVar8->length);
          local_4b0 = (undefined1  [8])
                      tcu::MessageBuilder::operator<<
                                (pMVar21,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
          std::operator<<((ostream *)local_4a8,(string *)&failNote);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_012119ec;
        }
      }
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
      ::push_back(this_01,(value_type *)&pLVar32[-1].additionalSegmentLocation);
      pLVar32 = (pointer)&pLVar32->additionalSegmentLocation;
    }
    if ((result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start ==
         result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish || in_stack_fffffffffffff978 != (float)(int)in_stack_fffffffffffff980) ||
       (segmentsB.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        segmentsB.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      if ((result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start !=
           result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         (segmentsB.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          segmentsB.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        if (((long)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x10) ||
           ((long)segmentsB.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)segmentsB.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x10)) {
          if ((long)segmentsB.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)segmentsB.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0x10) {
            result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)segmentsB.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)segmentsB.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)segmentsB.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
            segmentsB.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pfVar24;
            segmentsB.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)pfVar27;
            segmentsB.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pfVar6;
          }
          pfVar24 = result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          pSVar8 = (pointer)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start;
          pSVar9 = (pointer)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish;
          if ((long)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x10) {
            if (result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[1] <
                (segmentsB.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start)->length) {
              result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)segmentsB.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
              segmentsB.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pfVar24;
              pSVar8 = segmentsB.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pSVar9 = segmentsB.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              segmentsB.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start;
              segmentsB.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish;
            }
          }
          else if (result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[1] + 0.001 <
                   (segmentsB.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start)->length) {
            local_330 = (undefined1  [8])pTVar3;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
            std::operator<<(&local_328,
                            "Failure: the two additional segments are longer than the other segments"
                           );
            local_4b0 = (undefined1  [8])
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_330,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
            std::operator<<((ostream *)local_4a8,(string *)&failNote);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_012119ec;
          }
          result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)pSVar9;
          result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)pSVar8;
          pSVar8 = segmentsB.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar10 = (segmentsB.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start)->index;
          iVar13 = segmentsB.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].index;
          iVar34 = (int)(-lVar31 >> 3);
          if (iVar10 + iVar13 + 1 == iVar34) {
            additionalSegmentLength =
                 (segmentsB.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_start)->length;
            if ((((long)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start != 0x10) ||
                (additionalSegmentLocation = -1,
                additionalSegmentLength <
                result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[1] + -0.001)) &&
               (additionalSegmentLocation = iVar13, iVar10 < iVar13)) {
              additionalSegmentLocation = iVar10;
            }
            bVar5 = true;
            goto LAB_01211a08;
          }
          local_330 = (undefined1  [8])pTVar3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
          std::operator<<(&local_328,
                          "Failure: the two additional segments aren\'t placed symmetrically; ");
          std::operator<<(&local_328,"one is at index ");
          pMVar21 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_330,&pSVar8->index);
          std::operator<<(&(pMVar21->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          " and other is at index ");
          pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,&pSVar8[1].index);
          poVar1 = &pMVar21->m_str;
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          " (note: the two indexes should sum to ");
          std::ostream::operator<<(poVar1,iVar34 + -1);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          ", i.e. numberOfSegments-1)");
          local_4b0 = (undefined1  [8])
                      tcu::MessageBuilder::operator<<
                                (pMVar21,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
          std::operator<<((ostream *)local_4a8,(string *)&failNote);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          local_330 = (undefined1  [8])pTVar3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
          std::operator<<(&local_328,
                          "Failure: when dividing the segments to 2 groups by length, neither of the two groups has exactly 2 or 0 segments in it"
                         );
          local_4b0 = (undefined1  [8])
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_330,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
          std::operator<<((ostream *)local_4a8,(string *)&failNote);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        goto LAB_012119ec;
      }
      additionalSegmentLength = -1.0;
      if (lVar31 != -8) {
        additionalSegmentLength = pLVar19->additionalSegmentLength;
      }
      additionalSegmentLocation = -1;
      bVar5 = true;
    }
    else {
      local_330 = (undefined1  [8])pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
      std::operator<<(&local_328,
                      "Failure: clamped and final tessellation level are equal, but not all segments are of equal length."
                     );
      local_4b0 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_330,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
      std::operator<<((ostream *)local_4a8,(string *)&failNote);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_012119ec:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
      bVar5 = false;
    }
LAB_01211a08:
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
    ::~vector(&segmentsB);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
               *)&result_2);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
               *)&local_5f8);
    std::__cxx11::string::~string((string *)&failNote);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&sortedCoords.super__Vector_base<float,_std::allocator<float>_>);
    if (!bVar5) goto LAB_01212132;
    std::vector<float,_std::allocator<float>_>::push_back
              (&additionalSegmentLengths,&additionalSegmentLength);
    std::vector<int,_std::allocator<int>_>::push_back
              (&additionalSegmentLocations,&additionalSegmentLocation);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&tfResult.varying.super__Vector_base<float,_std::allocator<float>_>);
    lVar37 = local_5d8;
  }
  SVar2 = this->m_spacing;
  local_5f8._M_dataplus._M_p = (pointer)0x0;
  local_5f8._M_string_length = 0;
  local_5f8.field_2._M_allocated_capacity = 0;
  pLVar32 = (pointer)0x0;
  pfVar24 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar27 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pLVar19 = (pointer)0x0;
  for (lVar37 = 0; sVar7 = local_5f8._M_string_length,
      lVar37 < (int)((ulong)((long)pfVar27 - (long)pfVar24) >> 2); lVar37 = lVar37 + 1) {
    fVar38 = pfVar24[lVar37];
    fVar39 = additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[lVar37];
    iVar10 = additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar37];
    if ((pointer)local_5f8._M_string_length == pLVar32) {
      lVar31 = (long)pLVar32 - (long)pLVar19;
      if (lVar31 == 0x7ffffffffffffff8) {
        local_5f8._M_dataplus._M_p = (pointer)pLVar19;
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      __p = (pointer)(lVar31 / 0xc);
      pLVar23 = __p;
      if (pLVar32 == pLVar19) {
        pLVar23 = (pointer)&DAT_00000001;
      }
      this_04 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                 *)((long)&__p->tessLevel + (long)&pLVar23->tessLevel);
      if ((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
           *)0xaaaaaaaaaaaaaa9 < this_04) {
        this_04 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                   *)0xaaaaaaaaaaaaaaa;
      }
      if (CARRY8((ulong)pLVar23,(ulong)__p)) {
        this_04 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                   *)0xaaaaaaaaaaaaaaa;
      }
      pLVar22 = std::
                _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                ::_M_allocate(this_04,(size_t)pLVar30);
      *(float *)((long)pLVar22 + lVar31) = fVar38;
      *(float *)((long)pLVar22 + lVar31 + 4) = fVar39;
      *(int *)((long)pLVar22 + lVar31 + 8) = iVar10;
      __n = extraout_RDX;
      pLVar30 = pLVar22;
      for (pLVar23 = pLVar19; pLVar36 = pLVar30 + 1, pLVar23 != pLVar32; pLVar23 = pLVar23 + 1) {
        pLVar30->additionalSegmentLocation = pLVar23->additionalSegmentLocation;
        __n.index = (int)pLVar23->tessLevel;
        __n.length = pLVar23->additionalSegmentLength;
        pLVar30->tessLevel = (float)__n.index;
        pLVar30->additionalSegmentLength = __n.length;
        pLVar30 = pLVar36;
      }
      std::
      _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
      ::_M_deallocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                       *)pLVar19,__p,(size_t)__n);
      pLVar32 = pLVar22 + (long)this_04;
      pfVar24 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar27 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_5f8.field_2._M_allocated_capacity = (size_type)pLVar32;
    }
    else {
      *(float *)local_5f8._M_string_length = fVar38;
      *(float *)(local_5f8._M_string_length + 4) = fVar39;
      *(int *)(local_5f8._M_string_length + 8) = iVar10;
      pLVar36 = (pointer)(local_5f8._M_string_length + 0xc);
      pLVar22 = pLVar19;
      __p = pLVar30;
      fVar38 = in_stack_fffffffffffff978;
      fVar39 = in_stack_fffffffffffff980;
    }
    pLVar19 = pLVar22;
    pLVar30 = __p;
    in_stack_fffffffffffff978 = fVar38;
    in_stack_fffffffffffff980 = fVar39;
    local_5f8._M_string_length = (size_type)pLVar36;
  }
  lVar37 = local_5f8._M_string_length - (long)pLVar19;
  local_5f8._M_dataplus._M_p = (pointer)pLVar19;
  __first._M_current =
       std::
       _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
       ::_M_allocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                      *)(lVar37 / 0xc),(size_t)pLVar30);
  result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)(lVar37 + (long)__first._M_current);
  lVar37 = 0;
  while( true ) {
    pLVar30 = (pointer)((long)&pLVar19->tessLevel + lVar37);
    _Var33._M_current = (LineData *)((long)&(__first._M_current)->tessLevel + lVar37);
    if (pLVar30 == (pointer)sVar7) break;
    (_Var33._M_current)->additionalSegmentLocation = pLVar30->additionalSegmentLocation;
    fVar38 = pLVar30->additionalSegmentLength;
    (_Var33._M_current)->tessLevel = pLVar30->tessLevel;
    (_Var33._M_current)->additionalSegmentLength = fVar38;
    lVar37 = lVar37 + 0xc;
  }
  uVar26 = lVar37 / 0xc;
  result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = &(__first._M_current)->tessLevel;
  result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)_Var33._M_current;
  if (lVar37 != 0) {
    lVar31 = 0x3f;
    if (uVar26 != 0) {
      for (; uVar26 >> lVar31 == 0; lVar31 = lVar31 + -1) {
      }
    }
    __comp._M_comp.m_membP._4_4_ = in_stack_fffffffffffff97c;
    __comp._M_comp.m_membP._0_4_ = in_stack_fffffffffffff978;
    __comp._M_comp._8_4_ = in_stack_fffffffffffff980;
    __comp._M_comp._12_4_ = in_stack_fffffffffffff984;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,float>>>
              (__first,_Var33,(ulong)(((uint)lVar31 ^ 0x3f) * 2) ^ 0x7e,__comp);
    if (lVar37 < 0xc1) {
      __comp_02._M_comp.m_membP._4_4_ = in_stack_fffffffffffff97c;
      __comp_02._M_comp.m_membP._0_4_ = in_stack_fffffffffffff978;
      __comp_02._M_comp._8_4_ = in_stack_fffffffffffff980;
      __comp_02._M_comp._12_4_ = in_stack_fffffffffffff984;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,float>>>
                (__first,_Var33,__comp_02);
    }
    else {
      _Var33._M_current = __first._M_current + 0x10;
      __comp_00._M_comp.m_membP._4_4_ = in_stack_fffffffffffff97c;
      __comp_00._M_comp.m_membP._0_4_ = in_stack_fffffffffffff978;
      __comp_00._M_comp._8_4_ = in_stack_fffffffffffff980;
      __comp_00._M_comp._12_4_ = in_stack_fffffffffffff984;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,float>>>
                (__first,_Var33,__comp_00);
      for (lVar37 = lVar37 + -0xc0; lVar37 != 0; lVar37 = lVar37 + -0xc) {
        __comp_01._M_comp.m_membP._4_4_ = in_stack_fffffffffffff97c;
        __comp_01._M_comp.m_membP._0_4_ = in_stack_fffffffffffff978;
        __comp_01._M_comp._8_4_ = in_stack_fffffffffffff980;
        __comp_01._M_comp._12_4_ = in_stack_fffffffffffff984;
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>>>,__gnu_cxx::__ops::_Val_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,float>>>
                  (_Var33,__comp_01);
        _Var33._M_current = _Var33._M_current + 1;
      }
    }
  }
  _Var33._M_current = __first._M_current;
  for (lVar37 = 1; value_00 = _Var33._M_current + 1, lVar37 < (int)uVar26; lVar37 = lVar37 + 1) {
    iVar10 = _Var33._M_current[1].additionalSegmentLocation;
    if ((-1 < iVar10) && (iVar13 = (_Var33._M_current)->additionalSegmentLocation, -1 < iVar13)) {
      fVar38 = getClampedTessLevel(SVar2,value_00->tessLevel);
      fVar39 = getClampedTessLevel(SVar2,(_Var33._M_current)->tessLevel);
      if (iVar10 != iVar13) {
        if ((fVar38 == fVar39) && (!NAN(fVar38) && !NAN(fVar39))) {
          this_02 = (ostringstream *)&local_328;
          local_330 = (undefined1  [8])pTVar3;
          std::__cxx11::ostringstream::ostringstream(this_02);
          std::operator<<((ostream *)this_02,
                          "Failure: additional segments not located identically for two edges with identical clamped tessellation levels"
                         );
          local_4b0 = (undefined1  [8])
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_330,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
          std::operator<<((ostream *)local_4a8,"Note: tessellation levels are ");
          pMVar21 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_4b0,&value_00->tessLevel);
          std::operator<<(&(pMVar21->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          " and ");
          pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,&(_Var33._M_current)->tessLevel);
          poVar1 = &pMVar21->m_str;
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          " (clamped level ");
          fVar38 = getClampedTessLevel(SVar2,value_00->tessLevel);
          std::ostream::operator<<(poVar1,fVar38);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,")");
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          "; but first additional segments located at indices ");
          pMVar21 = tcu::MessageBuilder::operator<<
                              (pMVar21,&_Var33._M_current[1].additionalSegmentLocation);
          std::operator<<(&(pMVar21->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          " and ");
          pMVar21 = tcu::MessageBuilder::operator<<
                              (pMVar21,&(_Var33._M_current)->additionalSegmentLocation);
          std::operator<<(&(pMVar21->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          ", respectively");
          tcu::MessageBuilder::operator<<(pMVar21,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
          goto LAB_012125cb;
        }
      }
    }
    _Var33._M_current = value_00;
  }
  value = &__first._M_current[1].additionalSegmentLength;
  lVar37 = 1;
  do {
    if ((int)uVar26 <= lVar37) {
      bVar29 = 1;
LAB_012125d2:
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                 *)&result_2);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                 *)&local_5f8);
      local_600 = (qpTestResult)(bVar29 ^ 1);
      pcVar18 = "Invalid tessellation coordinates";
      if (bVar29 != 0) {
        pcVar18 = "Pass";
      }
LAB_0121260b:
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,local_600,pcVar18);
      TransformFeedbackHandler<float>::~TransformFeedbackHandler(&tfHandler);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&tessLevelCases.super__Vector_base<float,_std::allocator<float>_>);
      return STOP;
    }
    fVar38 = *value;
    if ((0.0 <= fVar38) && (0.0 <= value[-3])) {
      local_5d8 = CONCAT44(local_5d8._4_4_,value[-3]);
      fVar39 = getClampedTessLevel(SVar2,((LineData *)(value + -1))->tessLevel);
      clampedTessLevel = getClampedTessLevel(SVar2,value[-4]);
      iVar10 = getRoundedTessLevel(SVar2,fVar39);
      iVar13 = getRoundedTessLevel(SVar2,clampedTessLevel);
      if (iVar10 == iVar13) {
        if (fVar38 < (float)local_5d8) {
LAB_012123d7:
          failNote._M_dataplus._M_p = (pointer)pTVar3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&failNote._M_string_length);
          std::operator<<((ostream *)&failNote._M_string_length,
                          "Failure: additional segment length isn\'t monotonically decreasing with the fraction <n> - <f>, among edges with same final tessellation level"
                         );
          local_330 = (undefined1  [8])
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)&failNote,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
          std::operator<<(&local_328,
                          "Note: <f> stands for the clamped tessellation level and <n> for the final (rounded and clamped) tessellation level"
                         );
          local_4b0 = (undefined1  [8])
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_330,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
          std::operator<<((ostream *)local_4a8,"Note: two edges have tessellation levels ");
          pMVar21 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_4b0,value + -4);
          std::operator<<(&(pMVar21->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          " and ");
          pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,(float *)(value + -1));
          poVar1 = &pMVar21->m_str;
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          " respectively");
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", clamped ");
          std::ostream::operator<<(poVar1,clampedTessLevel);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," and ");
          std::ostream::operator<<(poVar1,fVar39);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", final ");
          std::ostream::operator<<(poVar1,iVar10);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," and ");
          std::ostream::operator<<(poVar1,iVar10);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          "; fractions are ");
          std::ostream::operator<<(poVar1,(float)iVar10 - clampedTessLevel);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," and ");
          std::ostream::operator<<(poVar1,(float)iVar10 - fVar39);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          ", but resulted in segment lengths ");
          pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,value + -3);
          std::operator<<(&(pMVar21->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          " and ");
          pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,value);
          tcu::MessageBuilder::operator<<(pMVar21,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
          this_02 = (ostringstream *)&failNote._M_string_length;
LAB_012125cb:
          std::__cxx11::ostringstream::~ostringstream(this_02);
          bVar29 = 0;
          goto LAB_012125d2;
        }
        if ((fVar38 != (float)local_5d8) || (NAN(fVar38) || NAN((float)local_5d8))) {
          if ((fVar39 == clampedTessLevel) && (!NAN(fVar39) && !NAN(clampedTessLevel)))
          goto LAB_012123d7;
        }
      }
    }
    lVar37 = lVar37 + 1;
    value = value + 3;
  } while( true );
}

Assistant:

FractionalSpacingModeCase::IterateResult FractionalSpacingModeCase::iterate (void)
{
	typedef TransformFeedbackHandler<float> TFHandler;

	TestLog&						log							= m_testCtx.getLog();
	const RenderContext&			renderCtx					= m_context.getRenderContext();
	const RandomViewport			viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32					programGL					= m_program->getProgram();
	const glw::Functions&			gl							= renderCtx.getFunctions();

	const int						tessLevelOuter1Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter1");

	// Second outer tessellation levels.
	const vector<float>				tessLevelCases				= genTessLevelCases();
	const int						maxNumVertices				= 1 + getClampedRoundedTessLevel(m_spacing, *std::max_element(tessLevelCases.begin(), tessLevelCases.end()));
	vector<float>					additionalSegmentLengths;
	vector<int>						additionalSegmentLocations;

	const TFHandler					tfHandler					(m_context.getRenderContext(), maxNumVertices);

	bool							success						= true;

	setViewport(gl, viewport);
	gl.useProgram(programGL);

	gl.patchParameteri(GL_PATCH_VERTICES, 1);

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < (int)tessLevelCases.size(); tessLevelCaseNdx++)
	{
		const float outerLevel1 = tessLevelCases[tessLevelCaseNdx];

		gl.uniform1f(tessLevelOuter1Loc, outerLevel1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup failed");

		{
			const TFHandler::Result		tfResult = tfHandler.renderAndGetPrimitives(programGL, GL_POINTS, 0, DE_NULL, 1);
			float						additionalSegmentLength;
			int							additionalSegmentLocation;

			success = verifyFractionalSpacingSingle(log, m_spacing, outerLevel1, tfResult.varying,
													additionalSegmentLength, additionalSegmentLocation);

			if (!success)
				break;

			additionalSegmentLengths.push_back(additionalSegmentLength);
			additionalSegmentLocations.push_back(additionalSegmentLocation);
		}
	}

	if (success)
		success = verifyFractionalSpacingMultiple(log, m_spacing, tessLevelCases, additionalSegmentLengths, additionalSegmentLocations);

	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Invalid tessellation coordinates");
	return STOP;
}